

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_rewriter.cpp
# Opt level: O2

unique_ptr<duckdb::SetTypesMatcher,_std::default_delete<duckdb::SetTypesMatcher>,_true>
duckdb::GetSmallIntegerTypesMatcher(void)

{
  unique_ptr<duckdb::SetTypesMatcher,_std::default_delete<duckdb::SetTypesMatcher>_> in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_f1;
  vector<duckdb::LogicalType,_true> types;
  LogicalType local_d8 [4];
  LogicalType local_78;
  LogicalType local_60;
  LogicalType local_48;
  LogicalType local_30;
  
  LogicalType::LogicalType(local_d8,TINYINT);
  LogicalType::LogicalType(local_d8 + 1,SMALLINT);
  LogicalType::LogicalType(local_d8 + 2,INTEGER);
  LogicalType::LogicalType(local_d8 + 3,BIGINT);
  LogicalType::LogicalType(&local_78,UTINYINT);
  LogicalType::LogicalType(&local_60,USMALLINT);
  LogicalType::LogicalType(&local_48,UINTEGER);
  LogicalType::LogicalType(&local_30,UBIGINT);
  __l._M_len = 8;
  __l._M_array = local_d8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__l,
             &local_f1);
  lVar1 = 0xa8;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_d8[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  make_uniq<duckdb::SetTypesMatcher,duckdb::vector<duckdb::LogicalType,true>>
            ((duckdb *)
             in_RDI._M_t.
             super___uniq_ptr_impl<duckdb::SetTypesMatcher,_std::default_delete<duckdb::SetTypesMatcher>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::SetTypesMatcher_*,_std::default_delete<duckdb::SetTypesMatcher>_>
             .super__Head_base<0UL,_duckdb::SetTypesMatcher_*,_false>._M_head_impl,&types);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  return (unique_ptr<duckdb::SetTypesMatcher,_std::default_delete<duckdb::SetTypesMatcher>_>)
         (__uniq_ptr_impl<duckdb::SetTypesMatcher,_std::default_delete<duckdb::SetTypesMatcher>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::SetTypesMatcher,_std::default_delete<duckdb::SetTypesMatcher>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::SetTypesMatcher_*,_std::default_delete<duckdb::SetTypesMatcher>_>
         .super__Head_base<0UL,_duckdb::SetTypesMatcher_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<SetTypesMatcher> GetSmallIntegerTypesMatcher() {
	vector<LogicalType> types {LogicalTypeId::TINYINT,  LogicalTypeId::SMALLINT, LogicalTypeId::INTEGER,
	                           LogicalTypeId::BIGINT,   LogicalTypeId::UTINYINT, LogicalTypeId::USMALLINT,
	                           LogicalTypeId::UINTEGER, LogicalTypeId::UBIGINT};
	return make_uniq<SetTypesMatcher>(std::move(types));
}